

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

void R_CreatePlayerTranslation
               (float h,float s,float v,FPlayerColorSet *colorset,FPlayerSkin *skin,
               FRemapTable *table,FRemapTable *alttable,FRemapTable *pillartable)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  spritedef_t *psVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_174;
  PalEntry *pPStack_170;
  float dummy;
  PalEntry *base;
  float mv [18];
  float local_118 [2];
  float ms [18];
  float local_c8 [2];
  float vs [9];
  float vdelta_1;
  float usev;
  float uses;
  BYTE *trans;
  FMemLump translump;
  bool identity;
  float range;
  float vdelta;
  float sdelta;
  float basev;
  float bases;
  float b;
  float g;
  float r;
  BYTE end;
  BYTE start;
  FRemapTable *pFStack_40;
  int i;
  FRemapTable *pillartable_local;
  FRemapTable *alttable_local;
  FRemapTable *table_local;
  FPlayerSkin *skin_local;
  FPlayerColorSet *colorset_local;
  float local_10;
  float v_local;
  float s_local;
  float h_local;
  
  g._3_1_ = skin->range0start;
  g._2_1_ = skin->range0end;
  pFStack_40 = pillartable;
  pillartable_local = alttable;
  alttable_local = table;
  table_local = (FRemapTable *)skin;
  skin_local = (FPlayerSkin *)colorset;
  colorset_local._4_4_ = v;
  local_10 = s;
  v_local = h;
  if ((skin->othergame & 1U) == 0) {
    for (r = 0.0; (int)r < table->NumEntries; r = (float)((int)r + 1)) {
      table->Remap[(int)r] = SUB41(r,0);
    }
    memcpy(table->Palette,&GPalette,(long)table->NumEntries << 2);
  }
  else {
    memcpy(table->Remap,OtherGameSkinRemap,(long)table->NumEntries);
    memcpy(alttable_local->Palette,OtherGameSkinPalette,(long)alttable_local->NumEntries << 2);
  }
  fVar9 = local_10;
  fVar8 = colorset_local._4_4_;
  for (r = 1.4013e-45; (int)r < alttable_local->NumEntries; r = (float)((int)r + 1)) {
    alttable_local->Palette[(int)r].field_0.field_0.a = 0xff;
  }
  if ((g._3_1_ == 0) && (g._2_1_ == 0)) {
    alttable_local->Inactive = true;
    FRemapTable::UpdateNative(alttable_local);
  }
  else {
    alttable_local->Inactive = false;
    fVar7 = (float)(int)(((uint)g._2_1_ - (uint)g._3_1_) + 1);
    sdelta = local_10;
    vdelta = colorset_local._4_4_;
    if ((skin_local != (FPlayerSkin *)0x0) &&
       ((-1 < *(int *)(skin_local->name + 4) &&
        (iVar3 = FWadCollection::LumpLength(&Wads,*(int *)(skin_local->name + 4)), iVar3 < 0x100))))
    {
      skin_local = (FPlayerSkin *)0x0;
    }
    if (skin_local == (FPlayerSkin *)0x0) {
      if ((gameinfo.gametype & GAME_DoomStrifeChex) == GAME_Any) {
        if (gameinfo.gametype == GAME_Heretic) {
          for (r = (float)(uint)g._3_1_; (int)r <= (int)(uint)g._2_1_; r = (float)((int)r + 1)) {
            colorset_local._4_4_ =
                 ((0.418916 / fVar7) * (float)(int)((int)r - (uint)g._3_1_) + fVar8) - 0.2352937;
            colorset_local._4_4_ = clamp<float>(colorset_local._4_4_,0.0,1.0);
            HSVtoRGB(&b,&bases,&basev,v_local,local_10,colorset_local._4_4_);
            SetRemap(alttable_local,(int)r,b,bases,basev);
          }
          if (pillartable_local != (FRemapTable *)0x0) {
            sdelta = MIN<float>(fVar9 * 1.3,1.0);
            vdelta = MIN<float>(fVar8 * 1.3,1.0);
            for (r = 2.03188e-43; (int)r < 0xa9; r = (float)((int)r + 1)) {
              local_10 = MIN<float>(sdelta,0.8965 - (float)((int)r + -0xa1) * 0.0962);
              colorset_local._4_4_ =
                   MIN<float>(1.0,((float)((int)r + -0x90) * 0.0489 + 0.2102) * vdelta);
              HSVtoRGB(&b,&bases,&basev,v_local,local_10,colorset_local._4_4_);
              SetRemap(pillartable_local,(int)r,b,bases,basev);
              SetPillarRemap(pFStack_40,(int)r,v_local,local_10,colorset_local._4_4_);
            }
            FRemapTable::UpdateNative(pillartable_local);
          }
        }
        else if (gameinfo.gametype == GAME_Hexen) {
          psVar5 = TArray<spritedef_t,_spritedef_t>::operator[]
                             (&sprites,(long)*(int *)&table_local[1].Native);
          if ((psVar5->field_0).dwName == 0x59414c50) {
            memcpy(local_c8,&DAT_008addb0,0x24);
            colorset_local._4_4_ = MAX<float>(0.1,colorset_local._4_4_);
            for (r = (float)(uint)g._3_1_; (int)r <= (int)(uint)g._2_1_; r = (float)((int)r + 1)) {
              HSVtoRGB(&b,&bases,&basev,v_local,local_10,
                       vs[(long)((int)(((int)r - (uint)g._3_1_) * 9) / (int)fVar7) + -2] * fVar8);
              SetRemap(alttable_local,(int)r,b,bases,basev);
            }
          }
          else {
            memcpy(local_118,&DAT_008adde0,0x48);
            memcpy(&base,&DAT_008ade30,0x48);
            colorset_local._4_4_ = MAX<float>(0.1,colorset_local._4_4_);
            for (r = (float)(uint)g._3_1_; (int)r <= (int)(uint)g._2_1_; r = (float)((int)r + 1)) {
              HSVtoRGB(&b,&bases,&basev,v_local,
                       ms[(long)((int)(((int)r - (uint)g._3_1_) * 0x12) / (int)fVar7) + -2] * fVar9,
                       mv[(long)((int)(((int)r - (uint)g._3_1_) * 0x12) / (int)fVar7) + -2] * fVar8)
              ;
              SetRemap(alttable_local,(int)r,b,bases,basev);
            }
          }
        }
      }
      else {
        local_10 = local_10 - 0.23;
        colorset_local._4_4_ = colorset_local._4_4_ + 0.1;
        for (r = (float)(uint)g._3_1_; (int)r <= (int)(uint)g._2_1_; r = (float)((int)r + 1)) {
          fVar8 = clamp<float>(local_10,0.0,1.0);
          fVar9 = clamp<float>(colorset_local._4_4_,0.0,1.0);
          HSVtoRGB(&b,&bases,&basev,v_local,fVar8,fVar9);
          SetRemap(alttable_local,(int)r,b,bases,basev);
          local_10 = 0.23 / fVar7 + local_10;
          colorset_local._4_4_ = -0.94112 / fVar7 + colorset_local._4_4_;
        }
      }
    }
    else {
      translump.Block.Chars._7_1_ = 1;
      if (*(int *)(skin_local->name + 4) < 0) {
        bVar2 = SetRange(alttable_local,(uint)g._3_1_,(uint)g._2_1_,(uint)(byte)skin_local->name[8],
                         (uint)(byte)skin_local->name[9]);
        bVar1 = translump.Block.Chars._7_1_ & 1 & bVar2;
        for (r = 0.0; translump.Block.Chars._7_1_ = bVar1 != 0,
            (int)r < (int)(uint)(byte)skin_local->name[0xb]; r = (float)((int)r + 1)) {
          bVar2 = SetRange(alttable_local,(uint)(byte)skin_local->face[(long)(int)r * 4 + -5],
                           (uint)(byte)skin_local->face[(long)(int)r * 4 + -4],
                           (uint)(byte)skin_local->face[(long)(int)r * 4 + -3],
                           (uint)(byte)skin_local->face[(long)(int)r * 4 + -2]);
          bVar1 = translump.Block.Chars._7_1_ & 1 & bVar2;
        }
      }
      else {
        FWadCollection::ReadLump((FWadCollection *)&trans,0x1f756a0);
        pvVar4 = FMemLump::GetMem((FMemLump *)&trans);
        for (r = (float)(uint)g._3_1_; (int)r <= (int)(uint)g._2_1_; r = (float)((int)r + 1)) {
          alttable_local->Remap[(int)r] = GPalette.Remap[*(byte *)((long)pvVar4 + (long)(int)r)];
          translump.Block.Chars._7_1_ =
               (translump.Block.Chars._7_1_ & 1 &
               (float)(uint)*(byte *)((long)pvVar4 + (long)(int)r) == r) != 0;
          alttable_local->Palette[(int)r].field_0 =
               GPalette.BaseColors[alttable_local->Remap[(int)r]].field_0;
          alttable_local->Palette[(int)r].field_0.field_0.a = 0xff;
        }
        FMemLump::~FMemLump((FMemLump *)&trans);
      }
      alttable_local->Inactive = (bool)(translump.Block.Chars._7_1_ & 1);
    }
    if ((gameinfo.gametype == GAME_Hexen) && (pillartable_local != (FRemapTable *)0x0)) {
      if ((skin_local == (FPlayerSkin *)0x0) || ((g._3_1_ != 0xa4 || (g._2_1_ != 0xb9)))) {
        for (r = 2.29813e-43; (int)r < 0xba; r = (float)((int)r + 1)) {
          lVar6 = (long)(int)r;
          pPStack_170 = GPalette.BaseColors + lVar6;
          RGBtoHSV((float)GPalette.BaseColors[lVar6].field_0.field_0.r / 255.0,
                   (float)GPalette.BaseColors[lVar6].field_0.field_0.g / 255.0,
                   (float)(pPStack_170->field_0).field_0.b / 255.0,&local_174,&local_10,
                   (float *)((long)&colorset_local + 4));
          HSVtoRGB(&b,&bases,&basev,v_local,local_10 * sdelta,colorset_local._4_4_ * vdelta);
          SetRemap(pillartable_local,(int)r,b,bases,basev);
        }
      }
      else {
        FRemapTable::operator=(pillartable_local,alttable_local);
      }
      FRemapTable::UpdateNative(pillartable_local);
    }
    FRemapTable::UpdateNative(alttable_local);
  }
  return;
}

Assistant:

static void R_CreatePlayerTranslation (float h, float s, float v, const FPlayerColorSet *colorset,
	FPlayerSkin *skin, FRemapTable *table, FRemapTable *alttable, FRemapTable *pillartable)
{
	int i;
	BYTE start = skin->range0start;
	BYTE end = skin->range0end;
	float r, g, b;
	float bases, basev;
	float sdelta, vdelta;
	float range;

	// Set up the base translation for this skin. If the skin was created
	// for the current game, then this is just an identity translation.
	// Otherwise, it remaps the colors from the skin's original palette to
	// the current one.
	if (skin->othergame)
	{
		memcpy (table->Remap, OtherGameSkinRemap, table->NumEntries);
		memcpy (table->Palette, OtherGameSkinPalette, sizeof(*table->Palette) * table->NumEntries);
	}
	else
	{
		for (i = 0; i < table->NumEntries; ++i)
		{
			table->Remap[i] = i;
		}
		memcpy(table->Palette, GPalette.BaseColors, sizeof(*table->Palette) * table->NumEntries);
	}
	for (i = 1; i < table->NumEntries; ++i)
	{
		table->Palette[i].a = 255;
	}

	// [GRB] Don't translate skins with color range 0-0 (APlayerPawn default)
	if (start == 0 && end == 0)
	{
		table->Inactive = true;
		table->UpdateNative();
		return;
	}

	table->Inactive = false;
	range = (float)(end-start+1);

	bases = s;
	basev = v;

	if (colorset != NULL && colorset->Lump >= 0 && Wads.LumpLength(colorset->Lump) < 256)
	{ // Bad table length. Ignore it.
		colorset = NULL;
	}

	if (colorset != NULL)
	{
		bool identity = true;
		// Use the pre-defined range instead of a custom one.
		if (colorset->Lump < 0)
		{
			identity &= SetRange(table, start, end, colorset->FirstColor, colorset->LastColor);
			for (i = 0; i < colorset->NumExtraRanges; ++i)
			{
				identity &= SetRange(table,
					colorset->Extra[i].RangeStart, colorset->Extra[i].RangeEnd,
					colorset->Extra[i].FirstColor, colorset->Extra[i].LastColor);
			}
		}
		else
		{
			FMemLump translump = Wads.ReadLump(colorset->Lump);
			const BYTE *trans = (const BYTE *)translump.GetMem();
			for (i = start; i <= end; ++i)
			{
				table->Remap[i] = GPalette.Remap[trans[i]];
				identity &= (trans[i] == i);
				table->Palette[i] = GPalette.BaseColors[table->Remap[i]];
				table->Palette[i].a = 255;
			}
		}
		// If the colorset created an identity translation mark it as inactive
		table->Inactive = identity;
	}
	else if (gameinfo.gametype & GAME_DoomStrifeChex)
	{
		// Build player sprite translation
		s -= 0.23f;
		v += 0.1f;
		sdelta = 0.23f / range;
		vdelta = -0.94112f / range;

		for (i = start; i <= end; i++)
		{
			float uses, usev;
			uses = clamp (s, 0.f, 1.f);
			usev = clamp (v, 0.f, 1.f);
			HSVtoRGB (&r, &g, &b, h, uses, usev);
			SetRemap(table, i, r, g, b);
			s += sdelta;
			v += vdelta;
		}
	}
	else if (gameinfo.gametype == GAME_Heretic)
	{
		float vdelta = 0.418916f / range;

		// Build player sprite translation
		for (i = start; i <= end; i++)
		{
			v = vdelta * (float)(i - start) + basev - 0.2352937f;
			v = clamp (v, 0.f, 1.f);
			HSVtoRGB (&r, &g, &b, h, s, v);
			SetRemap(table, i, r, g, b);
		}

		// Build rain/lifegem translation
		if (alttable)
		{
			bases = MIN (bases*1.3f, 1.f);
			basev = MIN (basev*1.3f, 1.f);
			for (i = 145; i <= 168; i++)
			{
				s = MIN (bases, 0.8965f - 0.0962f*(float)(i - 161));
				v = MIN (1.f, (0.2102f + 0.0489f*(float)(i - 144)) * basev);
				HSVtoRGB (&r, &g, &b, h, s, v);
				SetRemap(alttable, i, r, g, b);
				SetPillarRemap(pillartable, i, h, s, v);
			}
			alttable->UpdateNative();
		}
	}
	else if (gameinfo.gametype == GAME_Hexen)
	{
		if (memcmp (sprites[skin->sprite].name, "PLAY", 4) == 0)
		{ // The fighter is different! He gets a brown hairy loincloth, but the other
		  // two have blue capes.
			float vs[9] = { .28f, .32f, .38f, .42f, .47f, .5f, .58f, .71f, .83f };

			// Build player sprite translation
			//h = 45.f;
			v = MAX (0.1f, v);

			for (i = start; i <= end; i++)
			{
				HSVtoRGB (&r, &g, &b, h, s, vs[(i-start)*9/(int)range]*basev);
				SetRemap(table, i, r, g, b);
			}
		}
		else
		{
			float ms[18] = { .95f, .96f, .89f, .97f, .97f, 1.f, 1.f, 1.f, .97f, .99f, .87f, .77f, .69f, .62f, .57f, .47f, .43f };
			float mv[18] = { .16f, .19f, .22f, .25f, .31f, .35f, .38f, .41f, .47f, .54f, .60f, .65f, .71f, .77f, .83f, .89f, .94f, 1.f };

			// Build player sprite translation
			v = MAX (0.1f, v);

			for (i = start; i <= end; i++)
			{
				HSVtoRGB (&r, &g, &b, h, ms[(i-start)*18/(int)range]*bases, mv[(i-start)*18/(int)range]*basev);
				SetRemap(table, i, r, g, b);
			}
		}
	}
	if (gameinfo.gametype == GAME_Hexen && alttable != NULL)
	{
		// Build Hexen's lifegem translation.
		
		// Is the player's translation range the same as the gem's and we are using a
		// predefined translation? If so, then use the same one for the gem. Otherwise,
		// build one as per usual.
		if (colorset != NULL && start == 164 && end == 185)
		{
			*alttable = *table;
		}
		else
		{
			for (i = 164; i <= 185; ++i)
			{
				const PalEntry *base = &GPalette.BaseColors[i];
				float dummy;

				RGBtoHSV (base->r/255.f, base->g/255.f, base->b/255.f, &dummy, &s, &v);
				HSVtoRGB (&r, &g, &b, h, s*bases, v*basev);
				SetRemap(alttable, i, r, g, b);
			}
		}
		alttable->UpdateNative();
	}
	table->UpdateNative();
}